

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerHLSL::emit_block_hints(CompilerHLSL *this,SPIRBlock *block)

{
  switch(block->hint) {
  case HintUnroll:
    CompilerGLSL::statement<char_const(&)[9]>(&this->super_CompilerGLSL,(char (*) [9])"[unroll]");
    return;
  case HintDontUnroll:
    CompilerGLSL::statement<char_const(&)[7]>(&this->super_CompilerGLSL,(char (*) [7])"[loop]");
    return;
  case HintFlatten:
    CompilerGLSL::statement<char_const(&)[10]>(&this->super_CompilerGLSL,(char (*) [10])"[flatten]")
    ;
    return;
  case HintDontFlatten:
    CompilerGLSL::statement<char_const(&)[9]>(&this->super_CompilerGLSL,(char (*) [9])"[branch]");
    return;
  default:
    return;
  }
}

Assistant:

void CompilerHLSL::emit_block_hints(const SPIRBlock &block)
{
	switch (block.hint)
	{
	case SPIRBlock::HintFlatten:
		statement("[flatten]");
		break;
	case SPIRBlock::HintDontFlatten:
		statement("[branch]");
		break;
	case SPIRBlock::HintUnroll:
		statement("[unroll]");
		break;
	case SPIRBlock::HintDontUnroll:
		statement("[loop]");
		break;
	default:
		break;
	}
}